

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec3 __thiscall djb::microfacet::u2_to_s2(microfacet *this,vec2 *u,vec3 *wi,void *user_args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  args *paVar4;
  float fVar5;
  vec3 vVar6;
  vec3 vVar7;
  args args;
  vec3 local_70;
  args local_64;
  
  if (user_args == (void *)0x0) {
    local_70.x = 0.0;
    local_70.y = 0.0;
    local_70.z = 1.0;
    microfacet::args::normalmap(&local_64,&local_70,1.0,1.0,0.0);
  }
  else {
    paVar4 = &local_64;
    for (lVar3 = 0x13; lVar3 != 0; lVar3 = lVar3 + -1) {
      (paVar4->mtra).r[0].x = *user_args;
      user_args = (float_t *)((long)user_args + 4);
      paVar4 = (args *)&(paVar4->mtra).r[0].y;
    }
  }
  vVar6 = u2_to_h2(this,u,wi,&local_64);
  uVar1 = wi->x;
  uVar2 = wi->y;
  fVar5 = wi->z * vVar6.z + (float)uVar1 * vVar6.x + (float)uVar2 * vVar6.y;
  fVar5 = fVar5 + fVar5;
  vVar7.x = vVar6.x * fVar5 - (float)uVar1;
  vVar7.y = vVar6.y * fVar5 - (float)uVar2;
  vVar7.z = vVar6.z * fVar5 - wi->z;
  return vVar7;
}

Assistant:

vec3
microfacet::u2_to_s2(const vec2 &u, const vec3 &wi, const void *user_args) const
{
	//DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_s2(u2_to_h2(u, wi, args), wi);
}